

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
unregisterAll(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  HitCounter **curr;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            ).super_ThreadSafe._vptr_ThreadSafe[9])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    plVar1 = (long *)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    for (plVar3 = *(long **)CONCAT44(extraout_var,iVar2); plVar3 != plVar1; plVar3 = plVar3 + 1) {
      if ((long *)*plVar3 != (long *)0x0) {
        (**(code **)(*(long *)*plVar3 + 8))();
        *plVar3 = 0;
      }
    }
    iVar2 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar3[1] != *plVar3) {
      plVar3[1] = *plVar3;
    }
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }